

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O2

BSSRDFProbeSegment * __thiscall
pbrt::TabulatedBSSRDF::Sample
          (BSSRDFProbeSegment *__return_storage_ptr__,TabulatedBSSRDF *this,Float u1,Point2f *u2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  ulong uVar6;
  int ch;
  Float *in_R8;
  undefined1 auVar7 [16];
  Float FVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar14 [16];
  undefined1 auVar16 [12];
  undefined1 auVar15 [16];
  undefined1 in_ZMM4 [64];
  Point3<float> PVar17;
  Float u1_local;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  Tuple3<pbrt::Vector3,_float> local_58;
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 extraout_var [60];
  
  auVar16 = in_ZMM4._4_12_;
  local_58.x = 0.5;
  local_58.y = 0.25;
  local_58.z = 0.25;
  u1_local = u1;
  uVar5 = SampleDiscrete((pbrt *)&local_58,(span<const_float>)ZEXT816(3),u1,&u1_local,in_R8);
  if (2 < uVar5) {
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bssrdf.h"
             ,0xd2,"Unexpected value returned from SampleDiscrete");
  }
  uVar6 = (ulong)uVar5;
  fVar1 = *(float *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                            super_Tuple3<pbrt::Point3,_float>.x +
                    *(long *)(&DAT_028b3640 + uVar6 * 8));
  fVar2 = *(float *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                            super_Tuple3<pbrt::Point3,_float>.x +
                    *(long *)(&DAT_028b3628 + uVar6 * 8));
  fVar3 = *(float *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                            super_Tuple3<pbrt::Point3,_float>.x +
                    *(long *)(&DAT_028b3610 + uVar6 * 8));
  local_60 = *(float *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                               super_Tuple3<pbrt::Point3,_float>.x +
                       *(long *)(&DAT_028b3688 + uVar6 * 8));
  local_64 = *(float *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                               super_Tuple3<pbrt::Point3,_float>.x +
                       *(long *)(&DAT_028b3670 + uVar6 * 8));
  local_68 = *(float *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                               super_Tuple3<pbrt::Point3,_float>.x +
                       *(long *)(&DAT_028b3658 + uVar6 * 8));
  local_5c = (this->sigma_t).values.values[uVar6 * 3 + -0xb];
  ch = 3;
  if ((int)(u1_local * 4.0) < 3) {
    ch = (int)(u1_local * 4.0);
  }
  local_38 = *(undefined8 *)((this->sigma_t).values.values + uVar6 * 3 + -0xd);
  auVar7._0_4_ = (float)ch;
  auVar7._4_12_ = auVar16;
  auVar7 = vfmsub231ss_fma(auVar7,ZEXT416((uint)u1_local),SUB6416(ZEXT464(0x40800000),0));
  uStack_30 = 0;
  auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar7);
  u1_local = auVar7._0_4_;
  FVar8 = Sample_Sr(this,ch,(u2->super_Tuple2<pbrt::Point2,_float>).x);
  if (0.0 <= FVar8) {
    fVar10 = (u2->super_Tuple2<pbrt::Point2,_float>).y;
    auVar12._0_4_ = Sample_Sr(this,ch,0.999);
    auVar12._4_60_ = extraout_var;
    if (FVar8 < auVar12._0_4_) {
      fVar10 = fVar10 * 6.2831855;
      auVar7 = vfmsub213ss_fma(auVar12._0_16_,auVar12._0_16_,ZEXT416((uint)(FVar8 * FVar8)));
      if (auVar7._0_4_ < 0.0) {
        fVar9 = sqrtf(auVar7._0_4_);
      }
      else {
        auVar7 = vsqrtss_avx(auVar7,auVar7);
        fVar9 = auVar7._0_4_;
      }
      local_48 = ZEXT416((uint)(fVar9 + fVar9));
      fVar9 = cosf(fVar10);
      fVar10 = sinf(fVar10);
      local_58.z = FVar8 * (fVar10 * local_60 + fVar9 * fVar1);
      uVar13 = 0;
      auVar7 = vinsertps_avx(ZEXT416((uint)(FVar8 * (fVar10 * local_68 + fVar9 * fVar3))),
                             ZEXT416((uint)(FVar8 * (fVar10 * local_64 + fVar9 * fVar2))),0x10);
      local_58._0_8_ = vmovlps_avx(auVar7);
      PVar17 = Point3<float>::operator+(&this->po,(Vector3<float> *)&local_58);
      auVar15._0_4_ = (float)local_48._0_4_ * (float)local_38;
      auVar15._4_4_ = (float)local_48._0_4_ * local_38._4_4_;
      auVar15._8_4_ = (float)local_48._0_4_ * (float)uStack_30;
      auVar15._12_4_ = (float)local_48._0_4_ * uStack_30._4_4_;
      auVar4._8_4_ = 0xbf000000;
      auVar4._0_8_ = 0xbf000000bf000000;
      auVar4._12_4_ = 0xbf000000;
      auVar7 = vmulps_avx512vl(auVar15,auVar4);
      fVar1 = PVar17.super_Tuple3<pbrt::Point3,_float>.z + (float)local_48._0_4_ * local_5c * -0.5;
      auVar11._0_4_ = PVar17.super_Tuple3<pbrt::Point3,_float>.x + auVar7._0_4_;
      auVar11._4_4_ = PVar17.super_Tuple3<pbrt::Point3,_float>.y + auVar7._4_4_;
      auVar11._8_4_ = (float)uVar13 + auVar7._8_4_;
      auVar11._12_4_ = (float)((ulong)uVar13 >> 0x20) + auVar7._12_4_;
      FVar8 = this->time;
      auVar14._0_4_ = auVar15._0_4_ + auVar11._0_4_;
      auVar14._4_4_ = auVar15._4_4_ + auVar11._4_4_;
      auVar14._8_4_ = auVar15._8_4_ + auVar11._8_4_;
      auVar14._12_4_ = auVar15._12_4_ + auVar11._12_4_;
      uVar13 = vmovlps_avx(auVar11);
      (__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar13;
      (__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar13 >> 0x20);
      (__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.z = fVar1;
      uVar13 = vmovlps_avx(auVar14);
      (__return_storage_ptr__->p1).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar13;
      (__return_storage_ptr__->p1).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar13 >> 0x20);
      (__return_storage_ptr__->p1).super_Tuple3<pbrt::Point3,_float>.z =
           (float)local_48._0_4_ * local_5c + fVar1;
      __return_storage_ptr__->time = FVar8;
      __return_storage_ptr__->valid = true;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.z = 0;
  (__return_storage_ptr__->p1).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (__return_storage_ptr__->p1).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  __return_storage_ptr__->time = 0.0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x1d = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    BSSRDFProbeSegment Sample(Float u1, const Point2f &u2) const {
        // Choose projection axis for BSSRDF sampling
        Vector3f vx, vy, vz;
        switch (SampleDiscrete({0.5, .25, .25}, u1, nullptr, &u1)) {
        case 0:
            vx = ss;
            vy = ts;
            vz = Vector3f(ns);
            break;
        case 1:
            // Prepare for sampling rays with respect to _ss_
            vx = ts;
            vy = Vector3f(ns);
            vz = ss;
            break;

        case 2:
            // Prepare for sampling rays with respect to _ts_
            vx = Vector3f(ns);
            vy = ss;
            vz = ts;
            break;

        default:
            LOG_FATAL("Unexpected value returned from SampleDiscrete");
        }

        // Choose spectral channel for BSSRDF sampling
        int ch = std::min<int>(u1 * NSpectrumSamples, NSpectrumSamples - 1);
        u1 = std::min(u1 * NSpectrumSamples - ch, OneMinusEpsilon);

        // Sample BSSRDF profile in polar coordinates
        Float r = Sample_Sr(ch, u2[0]);
        if (r < 0)
            return {};
        Float phi = 2 * Pi * u2[1];

        // Compute BSSRDF profile bounds and intersection height
        Float rMax = Sample_Sr(ch, 0.999f);
        if (r >= rMax)
            return {};
        Float l = 2 * std::sqrt(rMax * rMax - r * r);

        // Return BSSRDF sampling ray segment
        Point3f pStart =
            po + r * (vx * std::cos(phi) + vy * std::sin(phi)) - l * vz * 0.5f;
        Point3f pTarget = pStart + l * vz;
        return BSSRDFProbeSegment{pStart, pTarget, time};
    }